

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.h
# Opt level: O0

Error __thiscall
asmjit::ZoneVector<asmjit::CBPass_*>::append
          (ZoneVector<asmjit::CBPass_*> *this,ZoneHeap *heap,CBPass **item)

{
  undefined8 *in_RDX;
  size_t in_RSI;
  long *in_RDI;
  Error _err;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  Error EVar1;
  
  if ((in_RDI[1] != in_RDI[2]) ||
     (EVar1 = ZoneVectorBase::_grow
                        ((ZoneVectorBase *)0x1,
                         (ZoneHeap *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                         (size_t)in_RDI,in_RSI), EVar1 == 0)) {
    *(undefined8 *)(*in_RDI + in_RDI[1] * 8) = *in_RDX;
    in_RDI[1] = in_RDI[1] + 1;
    EVar1 = 0;
  }
  return EVar1;
}

Assistant:

Error append(ZoneHeap* heap, const T& item) noexcept {
    if (ASMJIT_UNLIKELY(_length == _capacity))
      ASMJIT_PROPAGATE(grow(heap, 1));

    ::memcpy(static_cast<T*>(_data) + _length, &item, sizeof(T));

    _length++;
    return kErrorOk;
  }